

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

void __thiscall QProgressBar::setValue(QProgressBar *this,int value)

{
  bool bVar1;
  QProgressBarPrivate *val;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QProgressBarPrivate *d;
  QAccessibleValueChangeEvent event;
  undefined4 in_stack_ffffffffffffff88;
  QWidget *this_00;
  QVariant local_68;
  QAccessibleValueChangeEvent local_48 [64];
  QProgressBarPrivate *this_01;
  
  this_01 = *(QProgressBarPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  val = d_func((QProgressBar *)0x662a13);
  if ((val->value != in_ESI) &&
     (((in_ESI <= val->maximum && (*(int *)&(val->super_QWidgetPrivate).field_0x254 <= in_ESI)) ||
      ((val->maximum == 0 && (*(int *)&(val->super_QWidgetPrivate).field_0x254 == 0)))))) {
    val->value = in_ESI;
    valueChanged((QProgressBar *)0x662a88,(int)((ulong)in_RDI >> 0x20));
    bVar1 = QWidget::isVisible((QWidget *)0x662a91);
    if (bVar1) {
      memset(local_48,0xaa,0x40);
      ::QVariant::QVariant(&local_68,in_ESI);
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)this_00,
                 (QObject *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),(QVariant *)val);
      ::QVariant::~QVariant(&local_68);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_48);
    }
    bVar1 = QProgressBarPrivate::repaintRequired(this_01);
    if (bVar1) {
      QWidget::repaint(in_RDI);
    }
  }
  if (*(QProgressBarPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressBar::setValue(int value)
{
    Q_D(QProgressBar);
    if (d->value == value
            || ((value > d->maximum || value < d->minimum)
                && (d->maximum != 0 || d->minimum != 0)))
        return;
    d->value = value;
    emit valueChanged(value);
#if QT_CONFIG(accessibility)
    if (isVisible()) {
        QAccessibleValueChangeEvent event(this, value);
        QAccessible::updateAccessibility(&event);
    }
#endif
    if (d->repaintRequired())
        repaint();
}